

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform.cc
# Opt level: O0

bool __thiscall
sptk::FastFourierTransform::Run
          (FastFourierTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  value_type vVar5;
  value_type vVar6;
  int iVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first_01;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first_02;
  int iVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  int li_2;
  double t2_2;
  double t1_2;
  int lmxj;
  int j;
  int lmx_1;
  int dec_fft_length;
  double *yp_1;
  double *xp_1;
  double t2_1;
  double t1_1;
  int li_1;
  double *yp;
  double *xp;
  double t2;
  double t1;
  int li;
  double *ypi;
  double *xpi;
  int i;
  double *cosp;
  double *sinp;
  int lf;
  int lmx;
  int lix;
  double *y;
  double *x;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe78;
  double *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int iVar13;
  int local_150;
  reference local_148;
  reference local_140;
  int local_124;
  double *local_120;
  double *local_118;
  int local_fc;
  double *local_f8;
  double *local_f0;
  int local_e4;
  double *local_e0;
  double *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  
  if ((((((ulong)((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_RDI._M_current)[2]._M_current & 0x100000000) != 0) &&
       (sVar9 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar9 == (long)(*(int *)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)in_RDI._M_current)[1]._M_current + 1))) &&
      (sVar9 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar9 == (long)(*(int *)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_RDI._M_current)[1]._M_current + 1))) &&
     ((in_RCX != (vector<double,_std::allocator<double>_> *)0x0 &&
      (in_R8 != (vector<double,_std::allocator<double>_> *)0x0)))) {
    sVar9 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
    if (sVar9 != (long)*(int *)((long)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)in_RDI._M_current)[1]._M_current + 4)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0._M_current,
                 (size_type)in_stack_fffffffffffffe98._M_current);
    }
    sVar9 = std::vector<double,_std::allocator<double>_>::size(in_R8);
    if (sVar9 != (long)*(int *)((long)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)in_RDI._M_current)[1]._M_current + 4)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0._M_current,
                 (size_type)in_stack_fffffffffffffe98._M_current);
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __first_01._M_current._4_4_ = in_stack_fffffffffffffeac;
    __first_01._M_current._0_4_ = in_stack_fffffffffffffea8;
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (__first_01,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_RDI._M_current,(difference_type)in_stack_fffffffffffffe80);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    __first._M_current._4_4_ = in_stack_fffffffffffffe94;
    __first._M_current._0_4_ = in_stack_fffffffffffffe90;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first,in_RDI,in_stack_fffffffffffffe80);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __first_02._M_current._4_4_ = in_stack_fffffffffffffeac;
    __first_02._M_current._0_4_ = in_stack_fffffffffffffea8;
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (__first_02,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::size(in_RDX);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_RDI._M_current,(difference_type)in_stack_fffffffffffffe80);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    __first_00._M_current._4_4_ = in_stack_fffffffffffffe94;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffe90;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first_00,in_RDI,in_stack_fffffffffffffe80);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,0);
    local_c4 = *(int *)((long)in_RDI._M_current + 0xc);
    local_c8 = *(int *)(in_RDI._M_current + 2);
    local_cc = 1;
    for (; 1 < local_c8; local_c8 = local_c8 / 2) {
      local_d8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 3),0);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 3),0);
      local_e0 = pvVar12 + *(int *)((long)in_RDI._M_current + 0xc) / 4;
      for (local_e4 = 0; local_e4 < local_c8; local_e4 = local_e4 + 1) {
        local_f0 = pvVar10 + local_e4;
        local_f8 = pvVar11 + local_e4;
        for (local_fc = local_c4; local_fc <= *(int *)((long)in_RDI._M_current + 0xc);
            local_fc = local_c4 + local_fc) {
          dVar1 = *local_f0;
          dVar2 = local_f0[local_c8];
          dVar3 = *local_f8;
          dVar4 = local_f8[local_c8];
          *local_f0 = local_f0[local_c8] + *local_f0;
          *local_f8 = local_f8[local_c8] + *local_f8;
          local_f0[local_c8] = *local_e0 * (dVar1 - dVar2) + *local_d8 * (dVar3 - dVar4);
          local_f8[local_c8] = *local_e0 * (dVar3 - dVar4) + -(*local_d8 * (dVar1 - dVar2));
          local_f0 = local_f0 + local_c4;
          local_f8 = local_f8 + local_c4;
        }
        local_d8 = local_d8 + local_cc;
        local_e0 = local_e0 + local_cc;
      }
      local_c4 = local_c8;
      local_cc = local_cc << 1;
    }
    local_120 = pvVar11;
    local_118 = pvVar10;
    for (local_124 = 0; local_124 < *(int *)(in_RDI._M_current + 2); local_124 = local_124 + 1) {
      dVar1 = *local_118;
      dVar2 = local_118[1];
      dVar3 = *local_120;
      dVar4 = local_120[1];
      *local_118 = local_118[1] + *local_118;
      *local_120 = local_120[1] + *local_120;
      local_118[1] = dVar1 - dVar2;
      local_120[1] = dVar3 - dVar4;
      local_118 = local_118 + 2;
      local_120 = local_120 + 2;
    }
    iVar7 = *(int *)((long)in_RDI._M_current + 0xc);
    iVar13 = 0;
    local_148 = pvVar11;
    local_140 = pvVar10;
    for (local_150 = 0; local_150 < iVar7 + -1; local_150 = local_150 + 1) {
      iVar8 = local_150 - iVar13;
      if (iVar8 < 0) {
        vVar5 = *local_140;
        vVar6 = *local_148;
        *local_140 = local_140[iVar8];
        *local_148 = local_148[iVar8];
        local_140[iVar8] = vVar5;
        local_148[iVar8] = vVar6;
      }
      for (iVar8 = *(int *)(in_RDI._M_current + 2); iVar8 <= iVar13; iVar8 = iVar8 / 2) {
        iVar13 = iVar13 - iVar8;
      }
      iVar13 = iVar8 + iVar13;
      local_140 = pvVar10 + iVar13;
      local_148 = pvVar11 + iVar13;
    }
    return true;
  }
  return false;
}

Assistant:

bool FastFourierTransform::Run(const std::vector<double>& real_part_input,
                               const std::vector<double>& imag_part_input,
                               std::vector<double>* real_part_output,
                               std::vector<double>* imag_part_output) const {
  // Check inputs.
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(num_order_ + 1) ||
      imag_part_input.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == real_part_output || NULL == imag_part_output) {
    return false;
  }

  // Prepare memories.
  if (real_part_output->size() != static_cast<std::size_t>(fft_length_)) {
    real_part_output->resize(fft_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(fft_length_)) {
    imag_part_output->resize(fft_length_);
  }

  // Copy inputs and fill zero.
  std::copy(real_part_input.begin(), real_part_input.end(),
            real_part_output->begin());
  std::fill(real_part_output->begin() + real_part_input.size(),
            real_part_output->end(), 0.0);
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            imag_part_output->begin());
  std::fill(imag_part_output->begin() + imag_part_input.size(),
            imag_part_output->end(), 0.0);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));

  {
    int lix(fft_length_);
    int lmx(half_fft_length_);
    int lf(1);
    while (1 < lmx) {
      const double* sinp(&(sine_table_[0]));
      const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
      for (int i(0); i < lmx; ++i) {
        double* xpi(&(x[i]));
        double* ypi(&(y[i]));
        for (int li(lix); li <= fft_length_; li += lix) {
          const double t1(*(xpi) - *(xpi + lmx));
          const double t2(*(ypi) - *(ypi + lmx));
          *(xpi) += *(xpi + lmx);
          *(ypi) += *(ypi + lmx);
          *(xpi + lmx) = *cosp * t1 + *sinp * t2;
          *(ypi + lmx) = *cosp * t2 - *sinp * t1;
          xpi += lix;
          ypi += lix;
        }
        sinp += lf;
        cosp += lf;
      }
      lix = lmx;
      lmx /= 2;
      lf *= 2;
    }
  }

  {
    double* xp(x);
    double* yp(y);
    for (int li(0); li < half_fft_length_; ++li) {
      const double t1(*(xp) - *(xp + 1));
      const double t2(*(yp) - *(yp + 1));
      *(xp) += *(xp + 1);
      *(yp) += *(yp + 1);
      *(xp + 1) = t1;
      *(yp + 1) = t2;
      xp += 2;
      yp += 2;
    }
  }

  // Bit reversal.
  {
    double* xp(x);
    double* yp(y);
    const int dec_fft_length(fft_length_ - 1);
    for (int lmx(0), j(0); lmx < dec_fft_length; ++lmx) {
      const int lmxj(lmx - j);
      if (lmxj < 0) {
        const double t1(*(xp));
        const double t2(*(yp));
        *(xp) = *(xp + lmxj);
        *(yp) = *(yp + lmxj);
        *(xp + lmxj) = t1;
        *(yp + lmxj) = t2;
      }

      int li(half_fft_length_);
      while (li <= j) {
        j -= li;
        li /= 2;
      }
      j += li;
      xp = x + j;
      yp = y + j;
    }
  }

  return true;
}